

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

LBBox3fa * __thiscall
embree::SceneGraph::SubdivMeshNode::lbounds(LBBox3fa *__return_storage_ptr__,SubdivMeshNode *this)

{
  undefined1 auVar1 [16];
  pointer pvVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  size_t size;
  size_t t;
  ulong uVar5;
  long lVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  avector<BBox<Vec3fa>_> aStack_38;
  
  aStack_38.items = (BBox<embree::Vec3fa> *)0x0;
  aStack_38.size_active = 0;
  aStack_38.size_alloced = 0;
  size = (long)(this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  if (size != 0) {
    aStack_38.items = (BBox<embree::Vec3fa> *)alignedMalloc(size,0x10);
    aStack_38.size_alloced = (long)size >> 5;
  }
  aVar4 = _DAT_001f26d0;
  aVar3 = _DAT_001edc50;
  for (uVar5 = 0;
      pvVar2 = (this->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 5);
      uVar5 = uVar5 + 1) {
    aVar7 = aVar4;
    aVar8 = aVar3;
    for (lVar6 = 0; pvVar2[uVar5].size_active << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      auVar1 = *(undefined1 (*) [16])((long)&(pvVar2[uVar5].items)->field_0 + lVar6);
      aVar8.m128 = (__m128)minps(aVar8.m128,auVar1);
      aVar7.m128 = (__m128)maxps(aVar7.m128,auVar1);
    }
    aStack_38.items[uVar5].lower.field_0 = aVar8;
    aStack_38.items[uVar5].upper.field_0 = aVar7;
  }
  aStack_38.size_active = aStack_38.size_alloced;
  LBBox<embree::Vec3fa>::LBBox(__return_storage_ptr__,&aStack_38);
  alignedFree(aStack_38.items);
  return __return_storage_ptr__;
}

Assistant:

virtual LBBox3fa lbounds() const
      {
        avector<BBox3fa> bboxes(positions.size());
        for (size_t t=0; t<positions.size(); t++) {
          BBox3fa b = empty;
          for (auto& x : positions[t]) b.extend(x);
          bboxes[t] = b;
        }
        return LBBox3fa(bboxes);
      }